

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  ostream *poVar3;
  _Bit_type *p_Var4;
  _Bit_type *p_Var5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  ulong uVar9;
  string arg;
  Graph graph;
  char local_7d;
  undefined4 local_7c;
  vector<bool,_std::allocator<bool>_> local_78;
  Graph local_50;
  
  bVar8 = false;
  std::ios_base::sync_with_stdio(false);
  local_7c = 0;
  if (1 < argc) {
    uVar9 = 1;
    local_7c = 0;
    bVar8 = false;
    do {
      std::__cxx11::string::string((string *)&local_78,argv[uVar9],(allocator *)&local_50);
      uVar2 = std::__cxx11::string::compare((char *)&local_78);
      if ((int)uVar2 == 0) {
        local_7c = (undefined4)CONCAT71((int7)((ulong)uVar2 >> 8),1);
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&local_78);
        bVar8 = (bool)(bVar8 | iVar1 == 0);
      }
      if ((_Bit_iterator *)
          local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p !=
          &local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish) {
        operator_delete(local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (ulong)((long)local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                      _M_p + 1));
      }
      uVar9 = uVar9 + 1;
    } while ((uint)argc != uVar9);
  }
  readGraph(&local_50,(istream *)&std::cin);
  Graph::findVertexCover(&local_78,&local_50,(bool)((byte)local_7c & 1),bVar8);
  if (local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset != 0 ||
      local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p !=
      local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p) {
    uVar7 = 0;
    p_Var4 = local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p;
    do {
      bVar8 = uVar7 == 0x3f;
      uVar7 = uVar7 + 1;
      p_Var4 = p_Var4 + bVar8;
      if (bVar8) {
        uVar7 = 0;
      }
    } while (uVar7 != local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset ||
             p_Var4 != local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p);
  }
  poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
  local_7d = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_7d,1);
  uVar9 = (ulong)local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  if (((long)local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8 + uVar9 != 0) {
    uVar6 = 0;
    p_Var4 = local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p;
    p_Var5 = local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p;
    do {
      if ((p_Var4[uVar6 >> 6 & 0x3ffffff] >> (uVar6 & 0x3f) & 1) != 0) {
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar6);
        local_7d = ' ';
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_7d,1);
        uVar9 = (ulong)local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
        p_Var4 = local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        p_Var5 = local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar9 + ((long)p_Var5 - (long)p_Var4) * 8);
  }
  bVar8 = Graph::isVertexCover(&local_50,&local_78);
  if (bVar8) {
    if (local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_50.graph);
    return 0;
  }
  __assert_fail("graph.isVertexCover(vertexCover)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/crismaz[P]vertex-cover/main.cpp"
                ,0x30,"int main(int, char **)");
}

Assistant:

int main(int argc, char* argv[]) {
    std::ios_base::sync_with_stdio(false);

    bool useLinearProgramming = false, anyLpSolution = false;
    for (int index = 1; index < argc; index++) {
        std::string arg(argv[index]);
        if (arg == "-useLp") {
            useLinearProgramming = true;
        } else if (arg == "-anyLpSolution") {
            anyLpSolution = true;
        }
    }

    Graph graph = readGraph();
    auto vertexCover = graph.findVertexCover(useLinearProgramming, anyLpSolution);

    std::cout << std::count(vertexCover.begin(), vertexCover.end(), true) << '\n';
    for (int i = 0; i < vertexCover.size(); i++) {
        if (vertexCover[i]) {
            std::cout << i << ' ';
        }
    }

    assert(graph.isVertexCover(vertexCover)); // check that a valid vertex cover was found

    return 0;
}